

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdhopt.c
# Opt level: O2

int mbedtls_ecdhopt_initiator
              (mbedtls_ecdhopt_context *octx,mbedtls_ecdhopt_curve g,size_t *olen,uchar *buf,
              size_t blen,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  int iVar2;
  uint8_t base [32];
  
  octx->curve = g;
  if (g == MBEDTLS_ECP_DP_CURVE25519) {
    base[0x10] = '\0';
    base[0x11] = '\0';
    base[0x12] = '\0';
    base[0x13] = '\0';
    base[0x14] = '\0';
    base[0x15] = '\0';
    base[0x16] = '\0';
    base[0x17] = '\0';
    base[0x18] = '\0';
    base[0x19] = '\0';
    base[0x1a] = '\0';
    base[0x1b] = '\0';
    base[0x1c] = '\0';
    base[0x1d] = '\0';
    base[0x1e] = '\0';
    base[0x1f] = '\0';
    base[0] = '\0';
    base[1] = '\0';
    base[2] = '\0';
    base[3] = '\0';
    base[4] = '\0';
    base[5] = '\0';
    base[6] = '\0';
    base[7] = '\0';
    base[8] = '\0';
    base[9] = '\0';
    base[10] = '\0';
    base[0xb] = '\0';
    base[0xc] = '\0';
    base[0xd] = '\0';
    base[0xe] = '\0';
    base[0xf] = '\0';
    iVar1 = (*f_rng)(p_rng,(uchar *)&octx->ctx,0x20);
    if (iVar1 == 0) {
      *olen = 0x24;
      iVar1 = -0x4f00;
      if (0x23 < blen) {
        buf[0] = '\x03';
        buf[1] = '\0';
        buf[2] = '\x1d';
        buf[3] = ' ';
        base[0] = '\t';
        Hacl_Curve25519_crypto_scalarmult(buf + 4,(uint8_t *)&octx->ctx,base);
        base._0_8_ = (ulong)(uint7)base._1_7_ << 8;
        iVar2 = bcmp(buf + 4,base,0x20);
        iVar1 = -0x4d00;
        if (iVar2 != 0) {
          iVar1 = 0;
        }
      }
    }
  }
  else {
    iVar1 = mbedtls_ecp_group_load(&(octx->ctx).ec.grp,g);
    if (iVar1 == 0) {
      (octx->ctx).ec.point_format = octx->point_format;
      iVar1 = mbedtls_ecdh_make_params(&(octx->ctx).ec,olen,buf,blen,f_rng,p_rng);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ecdhopt_initiator( mbedtls_ecdhopt_context *octx,
                       mbedtls_ecdhopt_curve g, size_t *olen,
                       unsigned char *buf, size_t blen,
                       int (*f_rng)(void *, unsigned char *, size_t),
                       void *p_rng )
{
    int ret = 0;
    octx->curve = g;

    if( g == MBEDTLS_ECP_DP_CURVE25519 )
    {
          uint8_t base[32] = {0};

          if( ( ret = f_rng( p_rng, octx->ctx.x25519.our_secret, 32 ) ) != 0 )
              return ret;

          *olen = 36;
          if( blen < *olen )
              return( MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL );

          *buf++ = MBEDTLS_ECP_TLS_NAMED_CURVE;
          *buf++ = MBEDTLS_ECP_TLS_CURVE25519 >> 8;
          *buf++ = MBEDTLS_ECP_TLS_CURVE25519 & 0xFF;
          *buf++ = 32;

          base[0] = 9; // generator of x25519
          Hacl_Curve25519_crypto_scalarmult( buf, octx->ctx.x25519.our_secret, base );

          base[0] = 0;
          if( memcmp( buf, base, 32) == 0 )
              return MBEDTLS_ERR_ECP_RANDOM_FAILED;

        return( 0 );
    }
    else
    {
          if( ( ret = mbedtls_ecp_group_load( &octx->ctx.ec.grp, g ) ) != 0 )
              return( ret );

          octx->ctx.ec.point_format = octx->point_format;
          return mbedtls_ecdh_make_params( &octx->ctx.ec, olen, buf, blen, f_rng, p_rng );
    }
}